

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O3

bool dxil_spv::emit_interpolate_instruction(GLSLstd450 opcode,Impl *impl,CallInst *instruction)

{
  bool bVar1;
  GLSLstd450 GVar2;
  bool bVar3;
  Id IVar4;
  uint uVar5;
  ValueKind VVar6;
  Builder *this;
  mapped_type *pmVar7;
  Operation *pOVar8;
  Value *pVVar9;
  Constant *this_00;
  APInt *this_01;
  int64_t iVar10;
  Builder *this_02;
  Id IVar11;
  long lVar12;
  bool bVar13;
  Id offsets [2];
  uint32_t input_element_index;
  Id local_68 [3];
  GLSLstd450 local_5c;
  Id local_58;
  uint32_t local_54;
  Id local_50;
  Id local_4c;
  mapped_type *local_48;
  initializer_list<unsigned_int> local_40;
  
  this = Converter::Impl::builder(impl);
  bVar3 = get_constant_operand(&instruction->super_Instruction,1,&local_54);
  if (bVar3) {
    pmVar7 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->input_elements_meta,&local_54);
    IVar11 = pmVar7->id;
    IVar4 = spv::Builder::getDerefTypeId(this,IVar11);
    uVar5 = spv::Builder::getNumTypeConstituents(this,IVar4);
    local_5c = opcode;
    if (1 < uVar5) {
      IVar4 = Converter::Impl::get_effective_input_output_type_id(impl,pmVar7->component_type);
      IVar4 = spv::Builder::makePointer(this,StorageClassInput,IVar4);
      pOVar8 = Converter::Impl::allocate(impl,OpAccessChain,IVar4);
      local_50 = IVar11;
      pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
      local_4c = Converter::Impl::get_id_for_value(impl,pVVar9,0x20);
      local_40._M_len = 2;
      local_40._M_array = &local_50;
      Operation::add_ids(pOVar8,&local_40);
      Converter::Impl::add(impl,pOVar8,false);
      IVar11 = pOVar8->id;
    }
    GVar2 = local_5c;
    if (impl->glsl_std450_ext == 0) {
      IVar4 = spv::Builder::import(this,"GLSL.std.450");
      impl->glsl_std450_ext = IVar4;
    }
    local_58 = IVar11;
    if (GVar2 == GLSLstd450InterpolateAtSample) {
      pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
      IVar11 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
    }
    else {
      IVar11 = 0;
      if (GVar2 == GLSLstd450InterpolateAtOffset) {
        local_68[0] = 0;
        local_68[1] = 0;
        bVar1 = false;
        lVar12 = 0;
        local_48 = pmVar7;
LAB_0015d604:
        do {
          uVar5 = (uint)lVar12 | 4;
          pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar5);
          if (pVVar9 != (Value *)0x0) {
            this_00 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar9);
            VVar6 = LLVMBC::Value::get_value_kind((Value *)this_00);
            if (VVar6 == ConstantInt) {
              this_01 = LLVMBC::Constant::getUniqueInteger(this_00);
              iVar10 = LLVMBC::APInt::getSExtValue(this_01);
              IVar11 = spv::Builder::makeFloatConstant(this,(float)iVar10 * 0.0625,false);
              local_68[lVar12] = IVar11;
              bVar13 = lVar12 != 0;
              lVar12 = 1;
              if (bVar13) {
                if (!bVar1) {
                  IVar11 = spv::Builder::makeFloatType(this,0x20);
                  IVar11 = Converter::Impl::build_constant_vector(impl,IVar11,local_68,2);
                  pmVar7 = local_48;
                  goto LAB_0015d864;
                }
                break;
              }
              goto LAB_0015d604;
            }
          }
          pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar5);
          IVar11 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
          local_68[lVar12] = IVar11;
          this_02 = Converter::Impl::builder(impl);
          IVar4 = spv::Builder::makeIntegerType(this_02,0x20,false);
          pOVar8 = Converter::Impl::allocate(impl,OpBitFieldSExtract,IVar4);
          Operation::add_id(pOVar8,IVar11);
          IVar11 = spv::Builder::makeIntegerType(this_02,0x20,false);
          IVar11 = spv::Builder::makeIntConstant(this_02,IVar11,0,false);
          Operation::add_id(pOVar8,IVar11);
          IVar11 = spv::Builder::makeIntegerType(this_02,0x20,false);
          IVar11 = spv::Builder::makeIntConstant(this_02,IVar11,4,false);
          Operation::add_id(pOVar8,IVar11);
          IVar11 = pOVar8->id;
          Converter::Impl::add(impl,pOVar8,false);
          IVar4 = spv::Builder::makeFloatType(this_02,0x20);
          pOVar8 = Converter::Impl::allocate(impl,OpConvertSToF,IVar4);
          Operation::add_id(pOVar8,IVar11);
          IVar11 = pOVar8->id;
          Converter::Impl::add(impl,pOVar8,false);
          IVar4 = spv::Builder::makeFloatType(this_02,0x20);
          pOVar8 = Converter::Impl::allocate(impl,OpFMul,IVar4);
          local_50 = IVar11;
          local_4c = spv::Builder::makeFloatConstant(this_02,0.0625,false);
          local_40._M_array = &local_50;
          local_40._M_len = 2;
          Operation::add_ids(pOVar8,&local_40);
          IVar11 = pOVar8->id;
          Converter::Impl::add(impl,pOVar8,false);
          local_68[lVar12] = IVar11;
          bVar1 = true;
          bVar13 = lVar12 == 0;
          lVar12 = 1;
        } while (bVar13);
        IVar11 = spv::Builder::makeFloatType(this,0x20);
        IVar11 = Converter::Impl::build_vector(impl,IVar11,local_68,2);
        pmVar7 = local_48;
      }
    }
LAB_0015d864:
    IVar4 = Converter::Impl::get_effective_input_output_type_id(impl,pmVar7->component_type);
    pOVar8 = Converter::Impl::allocate(impl,OpExtInst,(Value *)instruction,IVar4);
    Operation::add_id(pOVar8,impl->glsl_std450_ext);
    Operation::add_literal(pOVar8,local_5c);
    Operation::add_id(pOVar8,local_58);
    if (IVar11 != 0) {
      Operation::add_id(pOVar8,IVar11);
    }
    Converter::Impl::add(impl,pOVar8,false);
    Converter::Impl::fixup_load_type_io(impl,pmVar7->component_type,1,(Value *)instruction);
    local_40._M_array = (iterator)CONCAT44(local_40._M_array._4_4_,0x34);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&this->capabilities,(Capability *)&local_40);
  }
  return bVar3;
}

Assistant:

bool emit_interpolate_instruction(GLSLstd450 opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t input_element_index;
	if (!get_constant_operand(instruction, 1, &input_element_index))
		return false;

	const auto &meta = impl.input_elements_meta[input_element_index];
	uint32_t var_id = meta.id;
	uint32_t ptr_id;

	uint32_t num_rows = builder.getNumTypeComponents(builder.getDerefTypeId(var_id));

	if (num_rows > 1)
	{
		// Need to deal with signed vs unsigned here.
		Operation *op =
			impl.allocate(spv::OpAccessChain,
			              builder.makePointer(spv::StorageClassInput,
			                                  impl.get_effective_input_output_type_id(meta.component_type)));

		op->add_ids({ var_id, impl.get_id_for_value(instruction->getOperand(3), 32) });
		impl.add(op);
		ptr_id = op->id;
	}
	else
		ptr_id = var_id;

	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	spv::Id aux_id = 0;

	if (opcode == GLSLstd450InterpolateAtOffset)
	{
		spv::Id offsets[2] = {};
		bool is_non_const = false;
		for (unsigned i = 0; i < 2; i++)
		{
			auto *operand = instruction->getOperand(4 + i);
			auto *constant_operand = llvm::dyn_cast<llvm::ConstantInt>(operand);

			// Need to do it the tedious way, extracting bits and converting to float ...
			if (!constant_operand)
			{
				offsets[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
				offsets[i] = build_attribute_offset(offsets[i], impl);
				is_non_const = true;
			}
			else
			{
				float off = float(constant_operand->getUniqueInteger().getSExtValue()) / 16.0f;
				offsets[i] = builder.makeFloatConstant(off);
			}
		}

		if (is_non_const)
			aux_id = impl.build_vector(builder.makeFloatType(32), offsets, 2);
		else
			aux_id = impl.build_constant_vector(builder.makeFloatType(32), offsets, 2);
	}
	else if (opcode == GLSLstd450InterpolateAtSample)
		aux_id = impl.get_id_for_value(instruction->getOperand(4));

	// Need to deal with signed vs unsigned here.
	Operation *op = impl.allocate(spv::OpExtInst, instruction,
	                              impl.get_effective_input_output_type_id(meta.component_type));
	op->add_id(impl.glsl_std450_ext);
	op->add_literal(opcode);
	op->add_id(ptr_id);

	if (aux_id)
		op->add_id(aux_id);

	impl.add(op);

	// Need to bitcast after we load.
	impl.fixup_load_type_io(meta.component_type, 1, instruction);
	builder.addCapability(spv::CapabilityInterpolationFunction);
	return true;
}